

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
vkt::wsi::anon_unknown_0::getSupportedQueueFamilyIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstanceInterface *vki,VkPhysicalDevice physicalDevice,VkSurfaceKHR surface)

{
  VkBool32 VVar1;
  value_type_conflict2 local_34;
  undefined1 local_2d;
  deUint32 queueFamilyNdx;
  VkPhysicalDevice pVStack_28;
  deUint32 numTotalFamilyIndices;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  VkSurfaceKHR surface_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *supportedFamilyIndices;
  
  pVStack_28 = physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vki;
  vki_local = (InstanceInterface *)surface.m_internal;
  surface_local.m_internal = (deUint64)__return_storage_ptr__;
  queueFamilyNdx = getNumQueueFamilyIndices(vki,physicalDevice);
  local_2d = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  for (local_34 = 0; local_34 < queueFamilyNdx; local_34 = local_34 + 1) {
    VVar1 = ::vk::wsi::getPhysicalDeviceSurfaceSupport
                      ((InstanceInterface *)physicalDevice_local,pVStack_28,local_34,
                       (VkSurfaceKHR)vki_local);
    if (VVar1 == 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_34);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<deUint32> getSupportedQueueFamilyIndices (const vk::InstanceInterface& vki, vk::VkPhysicalDevice physicalDevice, vk::VkSurfaceKHR surface)
{
	const deUint32		numTotalFamilyIndices	= getNumQueueFamilyIndices(vki, physicalDevice);
	vector<deUint32>	supportedFamilyIndices;

	for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < numTotalFamilyIndices; ++queueFamilyNdx)
	{
		if (vk::wsi::getPhysicalDeviceSurfaceSupport(vki, physicalDevice, queueFamilyNdx, surface) == VK_TRUE)
			supportedFamilyIndices.push_back(queueFamilyNdx);
	}

	return supportedFamilyIndices;
}